

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

nifti_image * nifti_convert_nhdr2nim(nifti_1_header nhdr,char *fname)

{
  undefined1 auVar1 [14];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [14];
  undefined1 auVar5 [15];
  undefined1 auVar6 [14];
  undefined1 auVar7 [15];
  undefined1 auVar8 [14];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [16];
  unkbyte9 Var13;
  undefined1 auVar14 [13];
  mat44 mat;
  mat44 mat_00;
  mat44 R;
  mat44 R_00;
  bool bVar15;
  undefined1 auVar16 [15];
  unkuint9 Var17;
  undefined1 auVar18 [11];
  undefined1 auVar19 [13];
  undefined1 auVar20 [14];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  float (*pafVar25) [4];
  short sVar26;
  int iVar27;
  nifti_image *nim;
  long lVar28;
  long lVar29;
  int iVar30;
  char *pcVar31;
  int iVar32;
  uint uVar33;
  char *pcVar34;
  size_t sVar35;
  byte bVar36;
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  ushort uVar37;
  float qb;
  float fVar38;
  float qc;
  float qd;
  float qx;
  undefined1 auVar41 [16];
  ulong uVar49;
  float qy;
  float qz;
  short asStackY_ffce [32611];
  float local_c8 [2];
  undefined8 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  
  bVar36 = 0;
  sVar35 = 1;
  nim = (nifti_image *)calloc(1,0x2b8);
  if (nim == (nifti_image *)0x0) {
    pcVar31 = "failed to allocate nifti image";
  }
  else {
    iVar27 = need_nhdr_swap(nhdr.dim[0],nhdr.sizeof_hdr);
    if (iVar27 < 0) {
      free(nim);
      if (iVar27 == -1) {
        pcVar31 = "bad dim[0]";
      }
      else {
        pcVar31 = "bad sizeof_hdr";
      }
    }
    else {
      if (((nhdr.magic[0] == 'n') && (nhdr.magic[3] == '\0')) &&
         ((byte)(nhdr.magic[2] - 0x31U) < 9 && (nhdr.magic[1] == '+' || nhdr.magic[1] == 'i'))) {
        iVar32 = (byte)nhdr.magic[2] - 0x30;
        bVar15 = true;
      }
      else {
        nim->analyze75_orient = (uint)(byte)nhdr.qform_code;
        bVar15 = false;
        iVar32 = 0;
      }
      if (iVar27 != 0) {
        if (3 < g_opts_0) {
          disp_nifti_1_header("-d ni1 pre-swap: ",&nhdr);
        }
        swap_nifti_header(&nhdr,iVar32);
      }
      if (2 < g_opts_0) {
        disp_nifti_1_header("-d nhdr2nim : ",&nhdr);
      }
      if (1 < (ushort)nhdr.datatype) {
        if (nhdr.dim[1] < 1) {
          free(nim);
          pcVar31 = "bad dim[1]";
          goto LAB_0010ad5e;
        }
        lVar28 = (long)nhdr.dim[0];
        for (lVar29 = 0x16; lVar29 + -0x14 <= lVar28; lVar29 = lVar29 + 1) {
          if (*(short *)(nhdr.data_type + lVar29 * 2 + -4) < 1) {
            pcVar31 = nhdr.data_type + lVar29 * 2 + -4;
            pcVar31[0] = '\x01';
            pcVar31[1] = '\0';
          }
        }
        for (; lVar28 < 7; lVar28 = lVar28 + 1) {
          if (1 < (ushort)nhdr.dim[lVar28 + 1]) {
            nhdr.dim[lVar28 + 1] = 1;
          }
        }
        for (lVar29 = 0x14; lVar29 + -0x13 <= (long)nhdr.dim[0]; lVar29 = lVar29 + 1) {
          uVar33 = *(uint *)(nhdr.data_type + lVar29 * 4 + -4) & 0x7fffffff;
          if ((uVar33 == 0 || uVar33 == 0x7f800000) || 0x7f800000 < uVar33) {
            pcVar31 = nhdr.data_type + lVar29 * 4 + -4;
            pcVar31[0] = '\0';
            pcVar31[1] = '\0';
            pcVar31[2] = -0x80;
            pcVar31[3] = '?';
          }
        }
        iVar30 = 0;
        if (bVar15) {
          iVar30 = (nhdr.magic[1] != '+') + 1;
        }
        nim->nifti_type = iVar30;
        nim->byteorder = 2 - (uint)(iVar27 == 0);
        nim->dim[0] = (int)nhdr.dim[0];
        nim->ndim = (int)nhdr.dim[0];
        nim->dim[1] = (int)nhdr.dim[1];
        nim->nx = (int)nhdr.dim[1];
        nim->dim[2] = (int)nhdr.dim[2];
        nim->ny = (int)nhdr.dim[2];
        nim->dim[3] = (int)nhdr.dim[3];
        nim->nz = (int)nhdr.dim[3];
        nim->dim[4] = (int)nhdr.dim[4];
        nim->nt = (int)nhdr.dim[4];
        nim->dim[5] = (int)nhdr.dim[5];
        nim->nu = (int)nhdr.dim[5];
        nim->dim[6] = (int)nhdr.dim[6];
        nim->nv = (int)nhdr.dim[6];
        nim->dim[7] = (int)nhdr.dim[7];
        nim->nw = (int)nhdr.dim[7];
        nim->nvox = 1;
        for (lVar29 = 0x15; lVar29 + -0x14 <= (long)nhdr.dim[0]; lVar29 = lVar29 + 1) {
          sVar35 = sVar35 * (long)*(short *)(nhdr.data_type + lVar29 * 2 + -4);
          nim->nvox = sVar35;
        }
        nim->datatype = (int)nhdr.datatype;
        nifti_datatype_sizes((int)nhdr.datatype,&nim->nbyper,&nim->swapsize);
        if (nim->nbyper != 0) {
          nim->pixdim[1] = nhdr.pixdim[1];
          nim->pixdim[2] = nhdr.pixdim[2];
          nim->pixdim[3] = nhdr.pixdim[3];
          nim->pixdim[4] = nhdr.pixdim[4];
          nim->dx = nhdr.pixdim[1];
          nim->dy = nhdr.pixdim[2];
          nim->dz = nhdr.pixdim[3];
          nim->dt = nhdr.pixdim[4];
          *(undefined8 *)(nim->pixdim + 5) = nhdr.pixdim._20_8_;
          nim->du = nhdr.pixdim[5];
          nim->dv = nhdr.pixdim[6];
          nim->pixdim[7] = nhdr.pixdim[7];
          nim->dw = nhdr.pixdim[7];
          if ((iVar32 == 0) || (CONCAT11(nhdr.qform_code._1_1_,(byte)nhdr.qform_code) < 1)) {
            (nim->qto_xyz).m[0][0] = nhdr.pixdim[1];
            (nim->qto_xyz).m[1][1] = nhdr.pixdim[2];
            (nim->qto_xyz).m[2][2] = nhdr.pixdim[3];
            *(float *)((long)((nim->qto_xyz).m + 0) + 4) = 0.0;
            *(float *)((long)((nim->qto_xyz).m + 0) + 8) = 0.0;
            *(undefined8 *)((nim->qto_xyz).m[0] + 3) = 0;
            pafVar25 = (nim->qto_xyz).m;
            *(float *)((long)(pafVar25 + 1) + 8) = 0.0;
            *(float *)((long)(pafVar25 + 1) + 0xc) = 0.0;
            *(float *)((long)((nim->qto_xyz).m + 2) + 0) = 0.0;
            *(float *)((long)((nim->qto_xyz).m + 2) + 4) = 0.0;
            *(undefined8 *)((nim->qto_xyz).m[2] + 3) = 0;
            pafVar25 = (nim->qto_xyz).m;
            *(float *)((long)(pafVar25 + 3) + 4) = 0.0;
            *(float *)((long)(pafVar25 + 3) + 8) = 0.0;
            (nim->qto_xyz).m[3][3] = 1.0;
            nim->qform_code = 0;
            if (1 < g_opts_0) {
              fwrite("-d no qform provided\n",0x15,1,_stderr);
            }
          }
          else {
            qb = (float)(~-(uint)(0x7f7fffff < (uint)ABS(nhdr.quatern_b)) & (uint)nhdr.quatern_b);
            qc = (float)(~-(uint)(0x7f7fffff < (uint)ABS(nhdr.quatern_c)) & (uint)nhdr.quatern_c);
            qd = (float)(~-(uint)(0x7f7fffff < (uint)ABS(nhdr.quatern_d)) & (uint)nhdr.quatern_d);
            qx = (float)(~-(uint)(0x7f7fffff < (uint)ABS(nhdr.qoffset_x)) & (uint)nhdr.qoffset_x);
            nim->quatern_b = qb;
            nim->quatern_c = qc;
            nim->quatern_d = qd;
            nim->qoffset_x = qx;
            qy = (float)(~-(uint)(0x7f7fffff < (uint)ABS(nhdr.qoffset_y)) & (uint)nhdr.qoffset_y);
            qz = (float)(~-(uint)(0x7f7fffff < (uint)ABS(nhdr.qoffset_z)) & (uint)nhdr.qoffset_z);
            nim->qoffset_y = qy;
            nim->qoffset_z = qz;
            fVar38 = *(float *)(&DAT_001134e0 + (ulong)(nhdr.pixdim[0] < 0.0) * 4);
            nim->qfac = fVar38;
            nifti_quatern_to_mat44
                      ((mat44 *)local_c8,qb,qc,qd,qx,qy,qz,nhdr.pixdim[1],nhdr.pixdim[2],
                       nhdr.pixdim[3],fVar38);
            *(undefined8 *)(nim->qto_xyz).m[3] = in_stack_ffffffffffffff68;
            *(undefined8 *)((nim->qto_xyz).m[3] + 2) = in_stack_ffffffffffffff70;
            *(undefined8 *)(nim->qto_xyz).m[2] = in_stack_ffffffffffffff58;
            *(undefined8 *)((nim->qto_xyz).m[2] + 2) = in_stack_ffffffffffffff60;
            *(undefined8 *)(nim->qto_xyz).m[1] = in_stack_ffffffffffffff48;
            *(undefined8 *)((nim->qto_xyz).m[1] + 2) = in_stack_ffffffffffffff50;
            *(float (*) [2])(nim->qto_xyz).m[0] = local_c8;
            *(undefined8 *)((nim->qto_xyz).m[0] + 2) = in_stack_ffffffffffffff40;
            nim->qform_code = (int)CONCAT11(nhdr.qform_code._1_1_,(byte)nhdr.qform_code);
            if (1 < g_opts_0) {
              local_c8 = *(float (*) [2])(nim->qto_xyz).m[0];
              in_stack_ffffffffffffff40 = *(undefined8 *)((nim->qto_xyz).m[0] + 2);
              in_stack_ffffffffffffff48 = *(undefined8 *)(nim->qto_xyz).m[1];
              in_stack_ffffffffffffff50 = *(undefined8 *)((nim->qto_xyz).m[1] + 2);
              in_stack_ffffffffffffff58 = *(undefined8 *)(nim->qto_xyz).m[2];
              in_stack_ffffffffffffff60 = *(undefined8 *)((nim->qto_xyz).m[2] + 2);
              in_stack_ffffffffffffff68 = *(undefined8 *)(nim->qto_xyz).m[3];
              in_stack_ffffffffffffff70 = *(undefined8 *)((nim->qto_xyz).m[3] + 2);
              mat.m[0][3] = SUB84(in_stack_ffffffffffffff40,4);
              mat.m[0]._0_12_ = *(undefined1 (*) [12])(nim->qto_xyz).m[0];
              mat.m[1][0] = (float)in_stack_ffffffffffffff48;
              mat.m[1][1] = SUB84(in_stack_ffffffffffffff48,4);
              mat.m[1][2] = (float)in_stack_ffffffffffffff50;
              mat.m[1][3] = SUB84(in_stack_ffffffffffffff50,4);
              mat.m[2][0] = (float)in_stack_ffffffffffffff58;
              mat.m[2][1] = SUB84(in_stack_ffffffffffffff58,4);
              mat.m[2][2] = (float)in_stack_ffffffffffffff60;
              mat.m[2][3] = SUB84(in_stack_ffffffffffffff60,4);
              mat.m[3][0] = (float)in_stack_ffffffffffffff68;
              mat.m[3][1] = SUB84(in_stack_ffffffffffffff68,4);
              mat.m[3][2] = (float)in_stack_ffffffffffffff70;
              mat.m[3][3] = SUB84(in_stack_ffffffffffffff70,4);
              nifti_disp_matrix_orient("-d qform orientations:\n",mat);
            }
          }
          R.m[0][2] = (float)in_stack_ffffffffffffff48;
          R.m[0][3] = SUB84(in_stack_ffffffffffffff48,4);
          R.m[0][0] = (float)in_stack_ffffffffffffff40;
          R.m[0][1] = SUB84(in_stack_ffffffffffffff40,4);
          R.m[1][0] = (float)in_stack_ffffffffffffff50;
          R.m[1][1] = SUB84(in_stack_ffffffffffffff50,4);
          R.m[1][2] = (float)in_stack_ffffffffffffff58;
          R.m[1][3] = SUB84(in_stack_ffffffffffffff58,4);
          R.m[2][0] = (float)in_stack_ffffffffffffff60;
          R.m[2][1] = SUB84(in_stack_ffffffffffffff60,4);
          R.m[2][2] = (float)in_stack_ffffffffffffff68;
          R.m[2][3] = SUB84(in_stack_ffffffffffffff68,4);
          R.m[3][0] = (float)in_stack_ffffffffffffff70;
          R.m[3][1] = SUB84(in_stack_ffffffffffffff70,4);
          R.m[3]._8_8_ = *(undefined8 *)(nim->qto_xyz).m[0];
          nifti_mat44_inverse(R);
          sVar26 = nhdr.sform_code;
          *(undefined8 *)(nim->qto_ijk).m[3] = in_stack_ffffffffffffff68;
          *(undefined8 *)((nim->qto_ijk).m[3] + 2) = in_stack_ffffffffffffff70;
          *(undefined8 *)(nim->qto_ijk).m[2] = in_stack_ffffffffffffff58;
          *(undefined8 *)((nim->qto_ijk).m[2] + 2) = in_stack_ffffffffffffff60;
          *(undefined8 *)(nim->qto_ijk).m[1] = in_stack_ffffffffffffff48;
          *(undefined8 *)((nim->qto_ijk).m[1] + 2) = in_stack_ffffffffffffff50;
          *(float (*) [2])(nim->qto_ijk).m[0] = local_c8;
          *(undefined8 *)((nim->qto_ijk).m[0] + 2) = in_stack_ffffffffffffff40;
          if (nhdr.sform_code < 1 || iVar32 == 0) {
            nim->sform_code = 0;
            if (1 < g_opts_0) {
              fwrite("-d no sform provided\n",0x15,1,_stderr);
            }
          }
          else {
            *(undefined8 *)(nim->sto_xyz).m[0] = nhdr.srow_x._0_8_;
            *(undefined8 *)((nim->sto_xyz).m[0] + 2) = nhdr.srow_x._8_8_;
            *(undefined8 *)(nim->sto_xyz).m[1] = nhdr.srow_y._0_8_;
            *(undefined8 *)((nim->sto_xyz).m[1] + 2) = nhdr.srow_y._8_8_;
            *(undefined8 *)(nim->sto_xyz).m[2] = nhdr.srow_z._0_8_;
            *(undefined8 *)((nim->sto_xyz).m[2] + 2) = nhdr.srow_z._8_8_;
            *(float *)((long)((nim->sto_xyz).m + 3) + 0) = 0.0;
            *(float *)((long)((nim->sto_xyz).m + 3) + 4) = 0.0;
            pafVar25 = (nim->sto_xyz).m;
            *(float *)((long)(pafVar25 + 3) + 8) = 0.0;
            *(float *)((long)(pafVar25 + 3) + 0xc) = 1.0;
            R_00.m[0][2] = (float)in_stack_ffffffffffffff48;
            R_00.m[0][3] = SUB84(in_stack_ffffffffffffff48,4);
            R_00.m[0][0] = (float)in_stack_ffffffffffffff40;
            R_00.m[0][1] = SUB84(in_stack_ffffffffffffff40,4);
            R_00.m[1][0] = (float)in_stack_ffffffffffffff50;
            R_00.m[1][1] = SUB84(in_stack_ffffffffffffff50,4);
            R_00.m[1][2] = (float)in_stack_ffffffffffffff58;
            R_00.m[1][3] = SUB84(in_stack_ffffffffffffff58,4);
            R_00.m[2][0] = (float)in_stack_ffffffffffffff60;
            R_00.m[2][1] = SUB84(in_stack_ffffffffffffff60,4);
            R_00.m[2][2] = (float)in_stack_ffffffffffffff68;
            R_00.m[2][3] = SUB84(in_stack_ffffffffffffff68,4);
            R_00.m[3][0] = (float)in_stack_ffffffffffffff70;
            R_00.m[3][1] = SUB84(in_stack_ffffffffffffff70,4);
            R_00.m[3]._8_8_ = *(undefined8 *)(nim->sto_xyz).m[0];
            nifti_mat44_inverse(R_00);
            *(undefined8 *)(nim->sto_ijk).m[3] = in_stack_ffffffffffffff68;
            *(undefined8 *)((nim->sto_ijk).m[3] + 2) = in_stack_ffffffffffffff70;
            *(undefined8 *)(nim->sto_ijk).m[2] = in_stack_ffffffffffffff58;
            *(undefined8 *)((nim->sto_ijk).m[2] + 2) = in_stack_ffffffffffffff60;
            *(undefined8 *)(nim->sto_ijk).m[1] = in_stack_ffffffffffffff48;
            *(undefined8 *)((nim->sto_ijk).m[1] + 2) = in_stack_ffffffffffffff50;
            *(float (*) [2])(nim->sto_ijk).m[0] = local_c8;
            *(undefined8 *)((nim->sto_ijk).m[0] + 2) = in_stack_ffffffffffffff40;
            nim->sform_code = (uint)(ushort)sVar26;
            if (1 < g_opts_0) {
              local_c8 = *(float (*) [2])(nim->sto_xyz).m[0];
              mat_00.m[0][3] = (float)(int)((ulong)*(undefined8 *)((nim->sto_xyz).m[0] + 2) >> 0x20)
              ;
              mat_00.m[0]._0_12_ = *(undefined1 (*) [12])(nim->sto_xyz).m[0];
              mat_00.m[1]._0_8_ = *(undefined8 *)(nim->sto_xyz).m[1];
              mat_00.m[1]._8_8_ = *(undefined8 *)((nim->sto_xyz).m[1] + 2);
              mat_00.m[2]._0_8_ = *(undefined8 *)(nim->sto_xyz).m[2];
              mat_00.m[2]._8_8_ = *(undefined8 *)((nim->sto_xyz).m[2] + 2);
              mat_00.m[3]._0_8_ = *(undefined8 *)(nim->sto_xyz).m[3];
              mat_00.m[3]._8_8_ = *(undefined8 *)((nim->sto_xyz).m[3] + 2);
              nifti_disp_matrix_orient("-d sform orientations:\n",mat_00);
            }
          }
          if (bVar15) {
            nim->scl_slope =
                 (float)(-(uint)((uint)ABS(nhdr.scl_slope) < 0x7f800000) & (uint)nhdr.scl_slope);
            nim->scl_inter =
                 (float)(-(uint)((uint)ABS(nhdr.scl_inter) < 0x7f800000) & (uint)nhdr.scl_inter);
            nim->intent_code = (int)nhdr.intent_code;
            nim->intent_p1 =
                 (float)(-(uint)((uint)ABS(nhdr.intent_p1) < 0x7f800000) & (uint)nhdr.intent_p1);
            nim->intent_p2 =
                 (float)(-(uint)((uint)ABS(nhdr.intent_p2) < 0x7f800000) & (uint)nhdr.intent_p2);
            fVar38 = nhdr.intent_p3;
            if (0x7f7fffff < (uint)ABS(nhdr.intent_p3)) {
              fVar38 = 0.0;
            }
            nim->intent_p3 = fVar38;
            fVar38 = nhdr.toffset;
            if (0x7f7fffff < (uint)ABS(nhdr.toffset)) {
              fVar38 = 0.0;
            }
            nim->toffset = fVar38;
            *(ulong *)nim->intent_name = CONCAT17(nhdr.intent_name[7],nhdr.intent_name._0_7_);
            *(ulong *)(nim->intent_name + 7) = CONCAT71(nhdr.intent_name._8_7_,nhdr.intent_name[7]);
            nim->intent_name[0xf] = '\0';
            Var13 = CONCAT81(nhdr._124_8_,nhdr.xyzt_units);
            auVar14._9_4_ = nhdr.slice_duration;
            auVar14._0_9_ = Var13;
            auVar12._13_3_ = nhdr.toffset._0_3_;
            auVar12._0_13_ = auVar14;
            auVar48._0_14_ = auVar12._0_14_;
            auVar48[0xe] = nhdr.cal_min._2_1_;
            auVar48[0xf] = nhdr.cal_min._2_1_;
            auVar47._14_2_ = auVar48._14_2_;
            auVar47[0xd] = nhdr.cal_min._1_1_;
            auVar47._0_13_ = auVar14;
            auVar46._13_3_ = auVar47._13_3_;
            auVar46._0_12_ = auVar14._0_12_;
            auVar46[0xc] = nhdr.cal_min._1_1_;
            auVar45._12_4_ = auVar46._12_4_;
            auVar45._0_11_ = auVar14._0_11_;
            auVar45[0xb] = nhdr.cal_min._0_1_;
            auVar44._11_5_ = auVar45._11_5_;
            auVar44._0_10_ = auVar14._0_10_;
            auVar44[10] = nhdr.cal_min._0_1_;
            auVar43._10_6_ = auVar44._10_6_;
            auVar43[9] = nhdr.cal_max._3_1_;
            auVar43._0_9_ = Var13;
            auVar42._9_7_ = auVar43._9_7_;
            auVar42._0_8_ = (undefined8)Var13;
            auVar42[8] = nhdr.cal_max._3_1_;
            auVar41._8_8_ = auVar42._8_8_;
            auVar41[7] = nhdr.cal_max._2_1_;
            auVar41[6] = nhdr.cal_max._2_1_;
            auVar41[5] = nhdr.cal_max._1_1_;
            auVar41[4] = nhdr.cal_max._1_1_;
            auVar41[3] = nhdr.cal_max._0_1_;
            auVar41[2] = nhdr.cal_max._0_1_;
            auVar41[1] = nhdr.xyzt_units;
            auVar41[0] = nhdr.xyzt_units;
            auVar39 = auVar41._0_15_ & DAT_00113450._0_15_;
            auVar40[0xd] = 0;
            auVar40._0_13_ = auVar39._0_13_;
            auVar40[0xe] = auVar39[7];
            auVar2[0xc] = auVar39[6];
            auVar2._0_12_ = auVar39._0_12_;
            auVar2._13_2_ = auVar40._13_2_;
            auVar3[0xb] = 0;
            auVar3._0_11_ = auVar39._0_11_;
            auVar3._12_3_ = auVar2._12_3_;
            auVar5[10] = auVar39[5];
            auVar5._0_10_ = auVar39._0_10_;
            auVar5._11_4_ = auVar3._11_4_;
            auVar7[9] = 0;
            auVar7._0_9_ = auVar39._0_9_;
            auVar7._10_5_ = auVar5._10_5_;
            auVar9[8] = auVar39[4];
            auVar9._0_8_ = auVar39._0_8_;
            auVar9._9_6_ = auVar7._9_6_;
            auVar16._7_8_ = 0;
            auVar16._0_7_ = auVar9._8_7_;
            Var17 = CONCAT81(SUB158(auVar16 << 0x40,7),auVar39[3]);
            auVar21._9_6_ = 0;
            auVar21._0_9_ = Var17;
            auVar18._1_10_ = SUB1510(auVar21 << 0x30,5);
            auVar18[0] = auVar39[2];
            auVar22._11_4_ = 0;
            auVar22._0_11_ = auVar18;
            auVar19._1_12_ = SUB1512(auVar22 << 0x20,3);
            auVar19[0] = auVar39[1];
            uVar37 = CONCAT11(0,auVar39[0]);
            auVar11._2_13_ = auVar19;
            auVar11._0_2_ = uVar37;
            auVar1._10_2_ = 0;
            auVar1._0_10_ = auVar11._0_10_;
            auVar1._12_2_ = (short)Var17;
            auVar20._2_4_ = auVar1._10_4_;
            auVar20._0_2_ = auVar18._0_2_;
            auVar20._6_8_ = 0;
            auVar8._6_8_ = SUB148(auVar20 << 0x40,6);
            auVar8._4_2_ = auVar19._0_2_;
            auVar8._2_2_ = 0;
            auVar8._0_2_ = uVar37;
            nim->xyz_units = (int)auVar8._0_8_;
            nim->time_units = (int)((ulong)auVar8._0_8_ >> 0x20);
            auVar40 = ZEXT215(CONCAT11((byte)nhdr.dim_info >> 2,nhdr.dim_info)) &
                      DAT_00113460._0_15_;
            auVar23._8_7_ = 0;
            auVar23._0_8_ = SUB158(ZEXT115(0) << 0x40,7);
            auVar24._10_5_ = 0;
            auVar24._0_10_ = SUB1510(auVar23 << 0x38,5);
            uVar37 = auVar40._0_2_;
            auVar39[2] = auVar40[1];
            auVar39._0_2_ = uVar37;
            auVar39._3_12_ = SUB1512(auVar24 << 0x28,3);
            auVar10._2_13_ = auVar39._2_13_;
            auVar10._0_2_ = uVar37 & 0xff;
            auVar4._4_2_ = auVar39._2_2_;
            auVar4._0_4_ = auVar10._0_4_;
            auVar4._6_8_ = SUB148(ZEXT214(0) << 0x40,6);
            auVar6._4_10_ = auVar4._4_10_;
            auVar6._0_4_ = auVar10._0_4_ & 0xffff;
            nim->freq_dim = (int)auVar6._0_8_;
            nim->phase_dim = (int)((ulong)auVar6._0_8_ >> 0x20);
            nim->slice_dim = (byte)nhdr.dim_info >> 4 & 3;
            nim->slice_code = (int)nhdr.slice_code;
            nim->slice_start = (int)nhdr.slice_start;
            nim->slice_end = (int)nhdr.slice_end;
            fVar38 = nhdr.slice_duration;
            if (0x7f7fffff < (uint)ABS(nhdr.slice_duration)) {
              fVar38 = 0.0;
            }
            nim->slice_duration = fVar38;
          }
          uVar49 = ~CONCAT44(-(uint)(0x7f7fffff < (uint)ABS(nhdr.cal_max)),
                             -(uint)(0x7f7fffff < (uint)ABS(nhdr.cal_min))) &
                   CONCAT44(nhdr.cal_max,nhdr.cal_min);
          nim->cal_min = (float)(int)uVar49;
          nim->cal_max = (float)(int)(uVar49 >> 0x20);
          pcVar31 = nhdr.descrip;
          pcVar34 = nim->descrip;
          for (lVar29 = 0x4f; lVar29 != 0; lVar29 = lVar29 + -1) {
            *pcVar34 = *pcVar31;
            pcVar31 = pcVar31 + (ulong)bVar36 * -2 + 1;
            pcVar34 = pcVar34 + (ulong)bVar36 * -2 + 1;
          }
          nim->descrip[0x4f] = '\0';
          *(undefined8 *)nim->aux_file = nhdr.aux_file._0_8_;
          *(ulong *)(nim->aux_file + 8) = CONCAT17(nhdr.aux_file[0xf],nhdr.aux_file._8_7_);
          iVar32 = (int)nhdr.vox_offset;
          *(ulong *)(nim->aux_file + 0xf) = CONCAT71(nhdr.aux_file._16_7_,nhdr.aux_file[0xf]);
          iVar27 = 0x15c;
          if (0x15c < iVar32) {
            iVar27 = iVar32;
          }
          nim->aux_file[0x17] = '\0';
          if (nhdr.magic[1] != '+') {
            iVar27 = iVar32;
          }
          if (!bVar15) {
            iVar27 = iVar32;
          }
          nim->iname_offset = iVar27;
          if (fname == (char *)0x0) {
            nim->fname = (char *)0x0;
            nim->iname = (char *)0x0;
          }
          else {
            nifti_set_filenames(nim,fname,0,0);
            if (nim->iname == (char *)0x0) {
              pcVar31 = "bad filename";
              goto LAB_0010ad5e;
            }
          }
          nim->num_ext = 0;
          nim->ext_list = (nifti1_extension *)0x0;
          return nim;
        }
      }
      free(nim);
      pcVar31 = "bad datatype";
    }
  }
LAB_0010ad5e:
  fprintf(_stderr,"** ERROR: nifti_convert_nhdr2nim: %s\n",pcVar31);
  return (nifti_image *)0x0;
}

Assistant:

nifti_image* nifti_convert_nhdr2nim(struct nifti_1_header nhdr,
                                    const char * fname)
{
   int   ii , doswap , ioff ;
   int   is_nifti , is_onefile ;
   nifti_image *nim;

   nim = (nifti_image *)calloc( 1 , sizeof(nifti_image) ) ;
   if( !nim ) ERREX("failed to allocate nifti image");

   /* be explicit with pointers */
   nim->fname = NULL;
   nim->iname = NULL;
   nim->data = NULL;

   /**- check if we must swap bytes */

   doswap = need_nhdr_swap(nhdr.dim[0], nhdr.sizeof_hdr); /* swap data flag */

   if( doswap < 0 ){
      free(nim);
      if( doswap == -1 ) ERREX("bad dim[0]") ;
      ERREX("bad sizeof_hdr") ;  /* else */
   }

   /**- determine if this is a NIFTI-1 compliant header */

   is_nifti = NIFTI_VERSION(nhdr) ;
   /*
    * before swapping header, record the Analyze75 orient code
    */
   if(!is_nifti)
     {
     /**- in analyze75, the orient code is at the same address as
      *   qform_code, but it's just one byte
      *   the qform_code will be zero, at which point you can check
      *   analyze75_orient if you care to.
      */
     unsigned char c = *((char *)(&nhdr.qform_code));
     nim->analyze75_orient = (analyze_75_orient_code)c;
     }
   if( doswap ) {
      if ( g_opts.debug > 3 ) disp_nifti_1_header("-d ni1 pre-swap: ", &nhdr);
      swap_nifti_header( &nhdr , is_nifti ) ;
   }

   if ( g_opts.debug > 2 ) disp_nifti_1_header("-d nhdr2nim : ", &nhdr);

   if( nhdr.datatype == DT_BINARY || nhdr.datatype == DT_UNKNOWN  )
   {
     free(nim);
     ERREX("bad datatype") ;
   }

   if( nhdr.dim[1] <= 0 )
   {
     free(nim);
     ERREX("bad dim[1]") ;
   }

   /* fix bad dim[] values in the defined dimension range */
   for( ii=2 ; ii <= nhdr.dim[0] ; ii++ )
     if( nhdr.dim[ii] <= 0 ) nhdr.dim[ii] = 1 ;

   /* fix any remaining bad dim[] values, so garbage does not propagate */
   /* (only values 0 or 1 seem rational, otherwise set to arbirary 1)   */
   for( ii=nhdr.dim[0]+1 ; ii <= 7 ; ii++ )
     if( nhdr.dim[ii] != 1 && nhdr.dim[ii] != 0) nhdr.dim[ii] = 1 ;

#if 0  /* rely on dim[0], do not attempt to modify it   16 Nov 2005 [rickr] */

   /**- get number of dimensions (ignoring dim[0] now) */
   for( ii=7 ; ii >= 2 ; ii-- )            /* loop backwards until we  */
     if( nhdr.dim[ii] > 1 ) break ;        /* find a dim bigger than 1 */
   ndim = ii ;
#endif

   /**- set bad grid spacings to 1.0 */

   for( ii=1 ; ii <= nhdr.dim[0] ; ii++ ){
     if( nhdr.pixdim[ii] == 0.0         ||
         !IS_GOOD_FLOAT(nhdr.pixdim[ii])  ) nhdr.pixdim[ii] = 1.0f ;
   }

  is_onefile = is_nifti && NIFTI_ONEFILE(nhdr) ;

  if( is_nifti ) nim->nifti_type = (is_onefile) ? NIFTI_FTYPE_NIFTI1_1
                                                : NIFTI_FTYPE_NIFTI1_2 ;
  else           nim->nifti_type = NIFTI_FTYPE_ANALYZE ;

  ii = nifti_short_order() ;
  if( doswap )   nim->byteorder = REVERSE_ORDER(ii) ;
  else           nim->byteorder = ii ;


  /**- set dimensions of data array */

  nim->ndim = nim->dim[0] = nhdr.dim[0];
  nim->nx   = nim->dim[1] = nhdr.dim[1];
  nim->ny   = nim->dim[2] = nhdr.dim[2];
  nim->nz   = nim->dim[3] = nhdr.dim[3];
  nim->nt   = nim->dim[4] = nhdr.dim[4];
  nim->nu   = nim->dim[5] = nhdr.dim[5];
  nim->nv   = nim->dim[6] = nhdr.dim[6];
  nim->nw   = nim->dim[7] = nhdr.dim[7];

  for( ii=1, nim->nvox=1; ii <= nhdr.dim[0]; ii++ )
     nim->nvox *= nhdr.dim[ii];

  /**- set the type of data in voxels and how many bytes per voxel */

  nim->datatype = nhdr.datatype ;

  nifti_datatype_sizes( nim->datatype , &(nim->nbyper) , &(nim->swapsize) ) ;
  if( nim->nbyper == 0 ){ free(nim); ERREX("bad datatype"); }

  /**- set the grid spacings */

  nim->dx = nim->pixdim[1] = nhdr.pixdim[1] ;
  nim->dy = nim->pixdim[2] = nhdr.pixdim[2] ;
  nim->dz = nim->pixdim[3] = nhdr.pixdim[3] ;
  nim->dt = nim->pixdim[4] = nhdr.pixdim[4] ;
  nim->du = nim->pixdim[5] = nhdr.pixdim[5] ;
  nim->dv = nim->pixdim[6] = nhdr.pixdim[6] ;
  nim->dw = nim->pixdim[7] = nhdr.pixdim[7] ;

  /**- compute qto_xyz transformation from pixel indexes (i,j,k) to (x,y,z) */

  if( !is_nifti || nhdr.qform_code <= 0 ){
    /**- if not nifti or qform_code <= 0, use grid spacing for qto_xyz */

    nim->qto_xyz.m[0][0] = nim->dx ;  /* grid spacings */
    nim->qto_xyz.m[1][1] = nim->dy ;  /* along diagonal */
    nim->qto_xyz.m[2][2] = nim->dz ;

    /* off diagonal is zero */

    nim->qto_xyz.m[0][1]=nim->qto_xyz.m[0][2]=nim->qto_xyz.m[0][3] = 0.0f;
    nim->qto_xyz.m[1][0]=nim->qto_xyz.m[1][2]=nim->qto_xyz.m[1][3] = 0.0f;
    nim->qto_xyz.m[2][0]=nim->qto_xyz.m[2][1]=nim->qto_xyz.m[2][3] = 0.0f;

    /* last row is always [ 0 0 0 1 ] */

    nim->qto_xyz.m[3][0]=nim->qto_xyz.m[3][1]=nim->qto_xyz.m[3][2] = 0.0f;
    nim->qto_xyz.m[3][3]= 1.0f ;

    nim->qform_code = NIFTI_XFORM_UNKNOWN ;

    if( g_opts.debug > 1 ) fprintf(stderr,"-d no qform provided\n");
  } else {
    /**- else NIFTI: use the quaternion-specified transformation */

    nim->quatern_b = FIXED_FLOAT( nhdr.quatern_b ) ;
    nim->quatern_c = FIXED_FLOAT( nhdr.quatern_c ) ;
    nim->quatern_d = FIXED_FLOAT( nhdr.quatern_d ) ;

    nim->qoffset_x = FIXED_FLOAT(nhdr.qoffset_x) ;
    nim->qoffset_y = FIXED_FLOAT(nhdr.qoffset_y) ;
    nim->qoffset_z = FIXED_FLOAT(nhdr.qoffset_z) ;

    nim->qfac = (nhdr.pixdim[0] < 0.0) ? -1.0f : 1.0f ;  /* left-handedness? */

    nim->qto_xyz = nifti_quatern_to_mat44(
                      nim->quatern_b, nim->quatern_c, nim->quatern_d,
                      nim->qoffset_x, nim->qoffset_y, nim->qoffset_z,
                      nim->dx       , nim->dy       , nim->dz       ,
                      nim->qfac                                      ) ;

    nim->qform_code = nhdr.qform_code ;

    if( g_opts.debug > 1 )
       nifti_disp_matrix_orient("-d qform orientations:\n", nim->qto_xyz);
  }

  /**- load inverse transformation (x,y,z) -> (i,j,k) */

  nim->qto_ijk = nifti_mat44_inverse( nim->qto_xyz ) ;

  /**- load sto_xyz affine transformation, if present */

  if( !is_nifti || nhdr.sform_code <= 0 ){
    /**- if not nifti or sform_code <= 0, then no sto transformation */

    nim->sform_code = NIFTI_XFORM_UNKNOWN ;

    if( g_opts.debug > 1 ) fprintf(stderr,"-d no sform provided\n");

  } else {
    /**- else set the sto transformation from srow_*[] */

    nim->sto_xyz.m[0][0] = nhdr.srow_x[0] ;
    nim->sto_xyz.m[0][1] = nhdr.srow_x[1] ;
    nim->sto_xyz.m[0][2] = nhdr.srow_x[2] ;
    nim->sto_xyz.m[0][3] = nhdr.srow_x[3] ;

    nim->sto_xyz.m[1][0] = nhdr.srow_y[0] ;
    nim->sto_xyz.m[1][1] = nhdr.srow_y[1] ;
    nim->sto_xyz.m[1][2] = nhdr.srow_y[2] ;
    nim->sto_xyz.m[1][3] = nhdr.srow_y[3] ;

    nim->sto_xyz.m[2][0] = nhdr.srow_z[0] ;
    nim->sto_xyz.m[2][1] = nhdr.srow_z[1] ;
    nim->sto_xyz.m[2][2] = nhdr.srow_z[2] ;
    nim->sto_xyz.m[2][3] = nhdr.srow_z[3] ;

    /* last row is always [ 0 0 0 1 ] */

    nim->sto_xyz.m[3][0]=nim->sto_xyz.m[3][1]=nim->sto_xyz.m[3][2] = 0.0f;
    nim->sto_xyz.m[3][3]= 1.0f ;

    nim->sto_ijk = nifti_mat44_inverse( nim->sto_xyz ) ;

    nim->sform_code = nhdr.sform_code ;

    if( g_opts.debug > 1 )
       nifti_disp_matrix_orient("-d sform orientations:\n", nim->sto_xyz);
  }

  /**- set miscellaneous NIFTI stuff */

  if( is_nifti ){
    nim->scl_slope   = FIXED_FLOAT( nhdr.scl_slope ) ;
    nim->scl_inter   = FIXED_FLOAT( nhdr.scl_inter ) ;

    nim->intent_code = nhdr.intent_code ;

    nim->intent_p1 = FIXED_FLOAT( nhdr.intent_p1 ) ;
    nim->intent_p2 = FIXED_FLOAT( nhdr.intent_p2 ) ;
    nim->intent_p3 = FIXED_FLOAT( nhdr.intent_p3 ) ;

    nim->toffset   = FIXED_FLOAT( nhdr.toffset ) ;

    memcpy(nim->intent_name,nhdr.intent_name,15); nim->intent_name[15] = '\0';

    nim->xyz_units  = XYZT_TO_SPACE(nhdr.xyzt_units) ;
    nim->time_units = XYZT_TO_TIME (nhdr.xyzt_units) ;

    nim->freq_dim  = DIM_INFO_TO_FREQ_DIM ( nhdr.dim_info ) ;
    nim->phase_dim = DIM_INFO_TO_PHASE_DIM( nhdr.dim_info ) ;
    nim->slice_dim = DIM_INFO_TO_SLICE_DIM( nhdr.dim_info ) ;

    nim->slice_code     = nhdr.slice_code  ;
    nim->slice_start    = nhdr.slice_start ;
    nim->slice_end      = nhdr.slice_end   ;
    nim->slice_duration = FIXED_FLOAT(nhdr.slice_duration) ;
  }

  /**- set Miscellaneous ANALYZE stuff */

  nim->cal_min = FIXED_FLOAT(nhdr.cal_min) ;
  nim->cal_max = FIXED_FLOAT(nhdr.cal_max) ;

  memcpy(nim->descrip ,nhdr.descrip ,79) ; nim->descrip [79] = '\0' ;
  memcpy(nim->aux_file,nhdr.aux_file,23) ; nim->aux_file[23] = '\0' ;

   /**- set ioff from vox_offset (but at least sizeof(header)) */

   is_onefile = is_nifti && NIFTI_ONEFILE(nhdr) ;

   if( is_onefile ){
     ioff = (int)nhdr.vox_offset ;
     if( ioff < (int) sizeof(nhdr) ) ioff = (int) sizeof(nhdr) ;
   } else {
     ioff = (int)nhdr.vox_offset ;
   }
   nim->iname_offset = ioff ;


   /**- deal with file names if set */
   if (fname!=NULL) {
       nifti_set_filenames(nim,fname,0,0);
       if (nim->iname==NULL)  { ERREX("bad filename"); }
   } else {
     nim->fname = NULL;
     nim->iname = NULL;
   }

   /* clear extension fields */
   nim->num_ext = 0;
   nim->ext_list = NULL;

   return nim;
}